

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void free_macro_call(macro_call_t mc)

{
  size_t sVar1;
  token_arr_t local_18;
  VARR_token_t *arg;
  macro_call_t mc_local;
  
  arg = (VARR_token_t *)mc;
  VARR_token_tdestroy(&mc->repl_buffer);
  if (arg[1].els_num != 0) {
    while (sVar1 = VARR_token_arr_tlength((VARR_token_arr_t *)arg[1].els_num), sVar1 != 0) {
      local_18 = VARR_token_arr_tpop((VARR_token_arr_t *)arg[1].els_num);
      VARR_token_tdestroy(&local_18);
    }
    VARR_token_arr_tdestroy((VARR_token_arr_t **)(arg + 1));
  }
  free(arg);
  return;
}

Assistant:

static void free_macro_call (macro_call_t mc) {
  VARR_DESTROY (token_t, mc->repl_buffer);
  if (mc->args != NULL) {
    while (VARR_LENGTH (token_arr_t, mc->args) != 0) {
      VARR (token_t) *arg = VARR_POP (token_arr_t, mc->args);
      VARR_DESTROY (token_t, arg);
    }
    VARR_DESTROY (token_arr_t, mc->args);
  }
  free (mc);
}